

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O1

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MutCommonExpr::set_position
          (MutCommonExpr *this,int k)

{
  Error *this_00;
  string local_38;
  
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  fmt::format<int>(&local_38,(CStringRef)0x4b85c8,
                   &(this->
                    super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                    ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_
                  );
  Error::Error(this_00,(CStringRef)local_38._M_dataplus._M_p,-1);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

int position() const {
      return this->problem_->common_expr_positions_[this->index_];
    }